

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<int,big_integer>
          (char *expected_expression,char *actual_expression,int *expected,big_integer *actual)

{
  bool bVar1;
  big_integer *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  big_integer *in_RSI;
  big_integer *in_RDI;
  AssertionResult AVar3;
  big_integer *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  big_integer *a;
  string local_b0 [32];
  string local_90 [31];
  undefined1 in_stack_ffffffffffffff8f;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  a = in_RDI;
  big_integer::big_integer(in_RDI,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  bVar1 = operator==(a,in_RDI);
  big_integer::~big_integer(in_stack_ffffffffffffff20);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<int,big_integer>((int *)in_RDX,in_RSI);
    FormatForComparisonFailureMessage<big_integer,int>(in_RDX,(int *)in_RSI);
    EqFailure(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
              in_stack_ffffffffffffff90,(bool)in_stack_ffffffffffffff8f);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = a;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}